

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.h
# Opt level: O2

bool __thiscall cmGlobalGenerator::MatchesGeneratorName(cmGlobalGenerator *this,string *name)

{
  __type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (*this->_vptr_cmGlobalGenerator[3])(&local_30,this);
  _Var1 = std::operator==(&local_30,name);
  std::__cxx11::string::~string((string *)&local_30);
  return _Var1;
}

Assistant:

virtual bool MatchesGeneratorName(const std::string& name) const
  {
    return this->GetName() == name;
  }